

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *this,void *value)

{
  iterator iVar1;
  void *in_RSI;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_RDI;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_stack_ffffffffffffffc8;
  char spec;
  error_handler local_19;
  
  if (in_RDI->specs_ != (format_specs *)0x0) {
    spec = (in_RDI->specs_->super_core_format_specs).type;
    error_handler::error_handler(&local_19);
    check_pointer_type_spec<char,fmt::v5::internal::error_handler>
              (spec,(error_handler *)in_stack_ffffffffffffffc8);
  }
  write_pointer(in_RDI,in_RSI);
  iVar1 = out(in_stack_ffffffffffffffc8);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }